

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff_igen_chunk.cpp
# Opt level: O1

void __thiscall sf2cute::SFRIFFIgenChunk::Write(SFRIFFIgenChunk *this,ostream *out)

{
  int iVar1;
  uint16_t uVar2;
  long lVar3;
  _Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
  _Var4;
  element_type *peVar5;
  size_type sVar6;
  int iVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  invalid_argument *piVar10;
  out_of_range *this_00;
  pointer psVar11;
  pointer pcVar12;
  SFGeneratorItem **generator_1;
  _Alloc_hider _Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  SFGeneratorItem **generator;
  pointer puVar14;
  bool bVar15;
  string local_80;
  undefined4 local_5c;
  SFRIFFIgenChunk *local_58;
  _Hashtable<const_sf2cute::SFSample_*,_std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_sf2cute::SFSample_*>,_std::hash<const_sf2cute::SFSample_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  lVar3 = *(long *)(*(long *)out + -0x18);
  local_5c = *(undefined4 *)(out + lVar3 + 0x1c);
  *(undefined4 *)(out + lVar3 + 0x1c) = 5;
  std::ios::clear((int)out + (int)lVar3);
  (*(this->super_RIFFChunkInterface)._vptr_RIFFChunkInterface[2])(&local_80,this);
  RIFFChunk::WriteHeader(out,&local_80,this->size_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  psVar11 = (this->instruments_->
            super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_48 = (this->instruments_->
             super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_58 = this;
  if (psVar11 != local_48) {
    local_50 = &(this->sample_index_map_)._M_h;
    do {
      _Var4.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl =
           (((psVar11->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->global_zone_)._M_t.
           super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
           ._M_t.
           super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
           .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>;
      if (_Var4.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl !=
          (SFInstrumentZone *)0x0) {
        lVar3 = *(long *)((long)_Var4.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>.
                                _M_head_impl + 0x40);
        if ((lVar3 != 0) && (*(int *)(lVar3 + 8) != 0)) {
          piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar10,"Global instrument zone cannot have a link to a sample.");
          __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        SortGenerators((vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>
                        *)&local_80,
                       (vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
                        *)((long)(((psVar11->
                                   super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->global_zone_)._M_t.
                                 super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
                                 .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false> + 8));
        sVar6 = local_80._M_string_length;
        for (_Var13._M_p = local_80._M_dataplus._M_p; _Var13._M_p != (pointer)sVar6;
            _Var13._M_p = _Var13._M_p + 8) {
          uVar2 = (*(uint16_t **)_Var13._M_p)[1];
          InsertInt16L<std::ostream>(out,**(uint16_t **)_Var13._M_p);
          InsertInt16L<std::ostream>(out,uVar2);
        }
        if (local_80._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_80._M_dataplus._M_p,
                          local_80.field_2._M_allocated_capacity - (long)local_80._M_dataplus._M_p);
        }
      }
      peVar5 = (psVar11->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      puVar14 = (peVar5->zones_).
                super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (peVar5->zones_).
                 super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_40 = psVar11;
      if (puVar14 != local_38) {
        do {
          SortGenerators((vector<sf2cute::SFGeneratorItem_*,_std::allocator<sf2cute::SFGeneratorItem_*>_>
                          *)&local_80,
                         (vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
                          *)((long)(puVar14->_M_t).
                                   super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
                                   .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false> + 8));
          sVar6 = local_80._M_string_length;
          for (_Var13._M_p = local_80._M_dataplus._M_p; _Var13._M_p != (pointer)sVar6;
              _Var13._M_p = _Var13._M_p + 8) {
            uVar2 = (*(uint16_t **)_Var13._M_p)[1];
            InsertInt16L<std::ostream>(out,**(uint16_t **)_Var13._M_p);
            InsertInt16L<std::ostream>(out,uVar2);
          }
          if (local_80._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_80._M_dataplus._M_p,
                            local_80.field_2._M_allocated_capacity - (long)local_80._M_dataplus._M_p
                           );
          }
          _Var4.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl =
               (puVar14->_M_t).
               super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
               ._M_t.
               super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
               .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>;
          if ((*(long *)((long)_Var4.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>.
                               _M_head_impl + 0x40) == 0) ||
             (*(int *)(*(long *)((long)_Var4.
                                       super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>.
                                       _M_head_impl + 0x40) + 8) == 0)) {
            piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (piVar10,"Instrument zone must have a link to a sample.");
            __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)_Var4.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>.
                            _M_head_impl + 0x40);
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            iVar7 = this_01->_M_use_count;
            do {
              if (iVar7 == 0) {
                this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                break;
              }
              LOCK();
              iVar1 = this_01->_M_use_count;
              bVar15 = iVar7 == iVar1;
              if (bVar15) {
                this_01->_M_use_count = iVar7 + 1;
                iVar1 = iVar7;
              }
              iVar7 = iVar1;
              UNLOCK();
            } while (!bVar15);
          }
          if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            bVar15 = true;
          }
          else {
            bVar15 = this_01->_M_use_count == 0;
          }
          if (bVar15) {
            pcVar12 = (pointer)0x0;
          }
          else {
            pcVar12 = *(pointer *)
                       ((long)_Var4.super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>.
                              _M_head_impl + 0x38);
          }
          local_80._M_dataplus._M_p = pcVar12;
          sVar8 = std::
                  _Hashtable<const_sf2cute::SFSample_*,_std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_sf2cute::SFSample_*>,_std::hash<const_sf2cute::SFSample_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(local_50,(key_type *)&local_80);
          if (sVar8 == 0) {
            this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
            std::out_of_range::out_of_range(this_00,"Instrument zone points to an unknown sample.");
            __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
          }
          local_80._M_dataplus._M_p = pcVar12;
          pmVar9 = std::__detail::
                   _Map_base<const_sf2cute::SFSample_*,_std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_sf2cute::SFSample_*>,_std::hash<const_sf2cute::SFSample_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<const_sf2cute::SFSample_*,_std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_sf2cute::SFSample_*>,_std::hash<const_sf2cute::SFSample_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)local_50,(key_type *)&local_80);
          uVar2 = *pmVar9;
          local_80._M_dataplus._M_p._0_1_ = 0x35;
          std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_80,1);
          local_80._M_dataplus._M_p = (pointer)((ulong)local_80._M_dataplus._M_p._1_7_ << 8);
          std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_80,1);
          InsertInt16L<std::ostream>(out,uVar2);
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          puVar14 = puVar14 + 1;
        } while (puVar14 != local_38);
      }
      psVar11 = local_40 + 1;
    } while (psVar11 != local_48);
  }
  local_80._M_dataplus._M_p = local_80._M_dataplus._M_p & 0xffffffffffffff00;
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_80,1);
  local_80._M_dataplus._M_p = local_80._M_dataplus._M_p & 0xffffffffffffff00;
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_80,1);
  InsertInt16L<std::ostream>(out,0);
  if ((local_58->size_ & 1) != 0) {
    local_80._M_dataplus._M_p = local_80._M_dataplus._M_p & 0xffffffffffffff00;
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_80,1);
  }
  return;
}

Assistant:

void SFRIFFIgenChunk::Write(std::ostream & out) const {
  // Save exception bits of output stream.
  const std::ios_base::iostate old_exception_bits = out.exceptions();
  // Set exception bits to get output error as an exception.
  out.exceptions(std::ios::badbit | std::ios::failbit);

  try {
    // Write the chunk header.
    RIFFChunk::WriteHeader(out, name(), size_);

    // Instruments:
    for (const auto & instrument : instruments()) {
      // Global zone:
      if (instrument->has_global_zone()) {
        // Check the sample for the global zone.
        if (instrument->global_zone().has_sample()) {
          // Throw exception if the global zone has a link to a sample.
          throw std::invalid_argument("Global instrument zone cannot have a link to a sample.");
        }

        // Write all the generators in the global zone.
        for (const auto & generator : SortGenerators(instrument->global_zone().generators())) {
          WriteItem(out, generator->op(), generator->amount());
        }
      }

      // Instrument zones:
      for (const auto & zone : instrument->zones()) {
        // Write all the generators in the instrument zone.
        for (const auto & generator : SortGenerators(zone->generators())) {
          WriteItem(out, generator->op(), generator->amount());
        }

        // Check the sample for the zone.
        if (zone->has_sample()) {
          // Find the index number for the sample.
          const auto & sample = zone->sample();
          if (sample_index_map().count(sample.get()) != 0) {
            // Write the sampleID generator.
            GenAmountType sample_index(sample_index_map().at(sample.get()));
            WriteItem(out, SFGenerator::kSampleID, sample_index);
          }
          else {
            // Throw exception if the sample could not be found in the index map.
            throw std::out_of_range("Instrument zone points to an unknown sample.");
          }
        }
        else {
          // Throw exception if the instrument zone does not have a link to a sample.
          throw std::invalid_argument("Instrument zone must have a link to a sample.");
        }
      }
    }

    // Write the last terminator item.
    WriteItem(out, SFGenerator(0), GenAmountType(0));

    // Write a padding byte if necessary.
    if (size_ % 2 != 0) {
      InsertInt8(out, 0);
    }
  }
  catch (const std::exception &) {
    // Recover exception bits of output stream.
    out.exceptions(old_exception_bits);

    // Rethrow the exception.
    throw;
  }
}